

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O0

void __thiscall DIS::IOEffect::IOEffect(IOEffect *this)

{
  IOEffect *this_local;
  
  this->_vptr_IOEffect = (_func_int **)&PTR__IOEffect_00267fd8;
  this->_recordType = 0x157c;
  this->_recordLength = 0x10;
  this->_ioStatus = '\0';
  this->_ioLinkType = '\0';
  EntityID::EntityID(&this->_ioEffect);
  this->_ioEffectDutyCycle = '\0';
  this->_ioEffectDuration = 0;
  this->_ioProcess = 0;
  this->_padding = 0;
  return;
}

Assistant:

IOEffect::IOEffect():
   _recordType(5500), 
   _recordLength(16), 
   _ioStatus(0), 
   _ioLinkType(0), 
   _ioEffect(), 
   _ioEffectDutyCycle(0), 
   _ioEffectDuration(0), 
   _ioProcess(0), 
   _padding(0)
{
}